

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaxUniformBufferBindingsCase::iterate
          (MaxUniformBufferBindingsCase *this)

{
  ostringstream *poVar1;
  TestLog *log;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  undefined4 extraout_var;
  CallLogWrapper gl;
  ResultCollector result;
  CallLogWrapper CStack_208;
  ResultCollector local_1f0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_128 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&CStack_208,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a0._0_8_ = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_1f0,log,(string *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
  }
  CStack_208.m_enableLog = true;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  iVar3 = 0x48;
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (bVar2) {
      local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "GL_EXT_tessellation_shader increases the minimum value of GL_MAX_UNIFORM_BUFFER_BINDINGS to 72"
                 ,0x5e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_128);
    }
    else {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
      ;
      iVar3 = 0x24;
      if (bVar2) {
        local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "GL_EXT_geometry_shader increases the minimum value of GL_MAX_UNIFORM_BUFFER_BINDINGS to 48"
                   ,0x5a);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_128);
        iVar3 = 0x30;
      }
    }
  }
  deqp::gls::StateQueryUtil::verifyStateIntegerMin
            (&local_1f0,&CStack_208,0x8a2f,iVar3,this->m_verifierType);
  tcu::ResultCollector::setTestContextResult
            (&local_1f0,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_prefix._M_dataplus._M_p != &local_1f0.m_prefix.field_2) {
    operator_delete(local_1f0.m_prefix._M_dataplus._M_p,
                    local_1f0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&CStack_208);
  return STOP;
}

Assistant:

MaxUniformBufferBindingsCase::IterateResult MaxUniformBufferBindingsCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	int						minMax;

	gl.enableLogging(true);

	if (contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		minMax = 72;
	}
	else
	{
		if (m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message
								<< "GL_EXT_tessellation_shader increases the minimum value of GL_MAX_UNIFORM_BUFFER_BINDINGS to 72"
								<< tcu::TestLog::EndMessage;
			minMax = 72;
		}
		else if (m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message
								<< "GL_EXT_geometry_shader increases the minimum value of GL_MAX_UNIFORM_BUFFER_BINDINGS to 48"
								<< tcu::TestLog::EndMessage;
			minMax = 48;
		}
		else
		{
			minMax = 36;
		}
	}

	// range [0, inf)
	verifyStateIntegerMin(result, gl, GL_MAX_UNIFORM_BUFFER_BINDINGS, minMax, m_verifierType);

	result.setTestContextResult(m_testCtx);
	return STOP;
}